

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall MCU::idct(MCU *this)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar4;
  void *extraout_RDX_01;
  BLOCK (*paaaadVar5) [2] [2];
  double *pdVar6;
  long lVar7;
  BLOCK (*paaaadVar8) [2] [2];
  ulong uVar9;
  long lVar10;
  int y;
  ulong uVar11;
  double *pdVar12;
  double *pdVar13;
  double extraout_XMM0_Qa;
  double dVar14;
  double extraout_XMM0_Qa_00;
  double s [8] [8];
  double tmp [8] [8];
  long local_4a8;
  long local_4a0;
  BLOCK (*local_490) [2] [2];
  BLOCK (*local_488) [2] [2];
  double local_438 [64];
  double local_238 [65];
  
  lVar7 = 1;
  local_4a0 = 0;
  local_490 = this->mcu + 1;
  do {
    uVar3 = (ulong)subVector[lVar7].height;
    if (subVector[lVar7].height != 0) {
      uVar11 = (ulong)subVector[lVar7].width;
      uVar9 = 0;
      paaaadVar8 = local_490;
      do {
        if ((char)uVar11 == '\0') {
          uVar11 = 0;
        }
        else {
          uVar3 = 0;
          local_488 = paaaadVar8;
          do {
            memset(local_238,0,0x200);
            memset(local_438,0,0x200);
            lVar10 = 8;
            lVar1 = 0;
            pvVar4 = extraout_RDX;
            do {
              lVar2 = 0;
              paaaadVar5 = local_488;
              do {
                pdVar6 = local_438 + lVar1 * 8 + lVar2;
                pdVar13 = cos_cache;
                uVar11 = 0;
                do {
                  c(this,(void *)(uVar11 & 0xffffffff),pvVar4);
                  dVar14 = extraout_XMM0_Qa * (*paaaadVar5)[0][0][0][uVar11] * *pdVar13 + *pdVar6;
                  *pdVar6 = dVar14;
                  uVar11 = uVar11 + 1;
                  pdVar13 = (double *)((long)pdVar13 + lVar10);
                  pvVar4 = extraout_RDX_00;
                } while (uVar11 != 8);
                *pdVar6 = dVar14 * 0.5;
                lVar2 = lVar2 + 1;
                paaaadVar5 = (BLOCK (*) [2] [2])((*paaaadVar5)[0][0] + 1);
              } while (lVar2 != 8);
              lVar1 = lVar1 + 1;
              lVar10 = lVar10 + 0x10;
            } while (lVar1 != 8);
            lVar1 = 8;
            local_4a8 = 0;
            do {
              pdVar6 = local_438;
              lVar10 = 0;
              do {
                pdVar13 = local_238 + local_4a8 * 8 + lVar10;
                pdVar12 = cos_cache;
                uVar11 = 0;
                do {
                  c(this,(void *)(uVar11 & 0xffffffff),pvVar4);
                  dVar14 = extraout_XMM0_Qa_00 * pdVar6[uVar11] * *pdVar12 + *pdVar13;
                  *pdVar13 = dVar14;
                  uVar11 = uVar11 + 1;
                  pdVar12 = (double *)((long)pdVar12 + lVar1);
                  pvVar4 = extraout_RDX_01;
                } while (uVar11 != 8);
                *pdVar13 = dVar14 * 0.5;
                lVar10 = lVar10 + 1;
                pdVar6 = pdVar6 + 8;
              } while (lVar10 != 8);
              local_4a8 = local_4a8 + 1;
              lVar1 = lVar1 + 0x10;
            } while (local_4a8 != 8);
            memcpy((this->mcu + 1)[local_4a0][uVar9] + uVar3,local_238,0x200);
            uVar3 = uVar3 + 1;
            uVar11 = (ulong)subVector[lVar7].width;
            local_488 = (BLOCK (*) [2] [2])((*local_488)[0] + 1);
          } while (uVar3 < uVar11);
          uVar3 = CONCAT71(0x10a0,subVector[lVar7].height);
        }
        uVar9 = uVar9 + 1;
        paaaadVar8 = (BLOCK (*) [2] [2])(*paaaadVar8 + 1);
      } while (uVar9 < (uVar3 & 0xff));
    }
    lVar7 = lVar7 + 1;
    local_4a0 = local_4a0 + 1;
    local_490 = local_490 + 1;
  } while (local_4a0 != 3);
  return;
}

Assistant:

void idct() {
        for (int id = 1; id <= 3; id++) {
            for (int h = 0; h < subVector[id].height; h++) {
                for (int w = 0; w < subVector[id].width; w++) {
                    double tmp[8][8] = {0};
//					 照定義展開，效能低下
//                     for (int i = 0; i < 8; i++) {
//                         for (int j = 0; j < 8; j++) {
//                             for (int x = 0; x < 8; x++) {
//                                 for (int y = 0; y < 8; y++) {
//                                     tmp[i][j] += (cc(x, y) * mcu[id][h][w][x][y] * cos((2*i+1)*M_PI/16.0*x) * cos((2*j+1)*M_PI/16.0*y));
//                                 }
//                             }
//                             tmp[i][j] /= 4.0;
//                         }
//                     }
					// 計算兩次一維idct去計算二維idct
                    double s[8][8] = {};
                    for (int j = 0; j < 8; j++) {
                        for (int x = 0; x < 8; x++) {
                            for (int y = 0; y < 8; y++) {
                                s[j][x] += c (y) * mcu[id][h][w][x][y] * cos_cache[(j + j + 1) * y];
                            }
                            s[j][x] = s[j][x] / 2.0;
                        }
                    }
                    for (int i = 0; i < 8; i++) {
                        for (int j = 0; j < 8; j++) {
                            for (int x = 0; x < 8; x++) {
                                tmp[i][j] += c(x) * s[j][x] * cos_cache[(i + i + 1) * x];
                            }
                            tmp[i][j] = tmp[i][j] / 2.0;
                        }
                    }
                    for (int i = 0; i < 8; i++) {
                        for (int j = 0; j < 8; j++) {
                            mcu[id][h][w][i][j] = tmp[i][j];
                        }
                    }
                }
            }
        }
    }